

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O1

Node * __thiscall FBX::Decoder::readFile(Node *__return_storage_ptr__,Decoder *this)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  invalid_argument *this_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodes;
  Node node;
  undefined1 local_b8 [16];
  pointer local_a8;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pcVar2 = (this->stream).data;
  sVar3 = (this->stream).cursor;
  (this->stream).cursor = sVar3 + 0x17;
  pcVar1 = pcVar2 + sVar3;
  pcVar2 = pcVar2 + sVar3 + 7;
  auVar6[0] = -(*pcVar2 == ' ');
  auVar6[1] = -(pcVar2[1] == 'F');
  auVar6[2] = -(pcVar2[2] == 'B');
  auVar6[3] = -(pcVar2[3] == 'X');
  auVar6[4] = -(pcVar2[4] == ' ');
  auVar6[5] = -(pcVar2[5] == 'B');
  auVar6[6] = -(pcVar2[6] == 'i');
  auVar6[7] = -(pcVar2[7] == 'n');
  auVar6[8] = -(pcVar2[8] == 'a');
  auVar6[9] = -(pcVar2[9] == 'r');
  auVar6[10] = -(pcVar2[10] == 'y');
  auVar6[0xb] = -(pcVar2[0xb] == ' ');
  auVar6[0xc] = -(pcVar2[0xc] == ' ');
  auVar6[0xd] = -(pcVar2[0xd] == '\0');
  auVar6[0xe] = -(pcVar2[0xe] == '\x1a');
  auVar6[0xf] = -(pcVar2[0xf] == '\0');
  auVar5[0] = -(*pcVar1 == 'K');
  auVar5[1] = -(pcVar1[1] == 'a');
  auVar5[2] = -(pcVar1[2] == 'y');
  auVar5[3] = -(pcVar1[3] == 'd');
  auVar5[4] = -(pcVar1[4] == 'a');
  auVar5[5] = -(pcVar1[5] == 'r');
  auVar5[6] = -(pcVar1[6] == 'a');
  auVar5[7] = -(pcVar1[7] == ' ');
  auVar5[8] = -(pcVar1[8] == 'F');
  auVar5[9] = -(pcVar1[9] == 'B');
  auVar5[10] = -(pcVar1[10] == 'X');
  auVar5[0xb] = -(pcVar1[0xb] == ' ');
  auVar5[0xc] = -(pcVar1[0xc] == 'B');
  auVar5[0xd] = -(pcVar1[0xd] == 'i');
  auVar5[0xe] = -(pcVar1[0xe] == 'n');
  auVar5[0xf] = -(pcVar1[0xf] == 'a');
  auVar5 = auVar5 & auVar6;
  if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
    initVersion(this);
    local_b8 = (undefined1  [16])0x0;
    local_a8 = (pointer)0x0;
    do {
      local_98._0_16_ = (undefined1  [16])0x0;
      local_98._24_8_ = 0;
      local_78._M_local_buf[0] = '\0';
      local_48 = (undefined1  [16])0x0;
      local_58 = (undefined1  [16])0x0;
      local_68 = (undefined1  [16])0x0;
      local_98._16_8_ = &local_78;
      bVar4 = readNode(this,(Node *)local_98);
      if (bVar4) {
        std::vector<FBX::Node,_std::allocator<FBX::Node>_>::push_back
                  ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_b8,(Node *)local_98);
      }
      std::
      vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                 *)(local_58 + 8));
      std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
                ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._16_8_ != &local_78) {
        operator_delete((void *)local_98._16_8_,
                        CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1)
        ;
      }
    } while (bVar4);
    __return_storage_ptr__->propertyCount = 0;
    __return_storage_ptr__->propertyLength = 0;
    (__return_storage_ptr__->id)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->id).field_2;
    (__return_storage_ptr__->id)._M_string_length = 0;
    (__return_storage_ptr__->id).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->children).super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->children).super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(__return_storage_ptr__->children).super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    (__return_storage_ptr__->properties).
    super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->properties).
    super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<FBX::Node,_std::allocator<FBX::Node>_>::operator=
              (&__return_storage_ptr__->children,
               (vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_b8);
    std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
              ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_b8);
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 "Invalid header, file is not an FBX binary file ",&this->path);
  std::invalid_argument::invalid_argument(this_00,(string *)local_98);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Node Decoder::readFile() {
        auto FBX_HEADER = "Kaydara FBX Binary  \x00\x1a\x00"sv;
        auto temp = stream.read<char>(FBX_HEADER.size());
        if (FBX_HEADER != std::string_view(temp.begin, FBX_HEADER.size()))
            throw std::invalid_argument("Invalid header, file is not an FBX binary file " + path);

        initVersion();

        std::vector<Node> nodes;
        while (true) {
            Node node;
            if (!readNode(node))
                break;
            nodes.push_back(node);
        }

        Node root;
        root.children = nodes;

        return root;
    }